

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void cs::
     foreach_helper<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,cs_impl::any>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end3;
  iterator __begin3;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range3;
  any *it;
  const_iterator __end0;
  const_iterator __begin0;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *__range2;
  scope_guard scope;
  _Self *in_stack_fffffffffffffe58;
  process_context *in_stack_fffffffffffffe60;
  any *in_stack_fffffffffffffee0;
  var *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  domain_manager *in_stack_ffffffffffffff50;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_90;
  undefined8 local_70;
  reference local_68;
  iterator local_60;
  iterator local_50;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *local_30;
  undefined8 local_20;
  
  local_20 = in_RCX;
  cs_impl::any::
  const_val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
            (in_stack_fffffffffffffee0);
  bVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ::empty((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                   *)0x5e60ac);
  if (!bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5e60c4);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5e60d0);
    if ((peVar2->break_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e60e6);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e60f2);
      peVar2->break_block = false;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5e6106);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5e6112);
    if ((peVar2->continue_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e6128);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e6134);
      peVar2->continue_block = false;
    }
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffe60,(context_t *)in_stack_fffffffffffffe58);
    local_30 = cs_impl::any::
               const_val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                         (in_stack_fffffffffffffee0);
    local_50 = (iterator)
               phmap::priv::
               raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                        *)in_stack_fffffffffffffe60);
    local_60 = (iterator)
               phmap::priv::
               raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               ::end((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                      *)in_stack_fffffffffffffe60);
    while( true ) {
      bVar1 = phmap::priv::operator!=
                        ((const_iterator *)in_stack_fffffffffffffe60,
                         (const_iterator *)in_stack_fffffffffffffe58);
      if (!bVar1) break;
      local_68 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                 ::const_iterator::operator*((const_iterator *)0x5e620c);
      process_context::poll_event(in_stack_fffffffffffffe60);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e623e);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x5e624a);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_70 = local_20;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe58);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffe58);
      while( true ) {
        bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        if (!bVar1) break;
        in_stack_ffffffffffffff48 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
             operator*(&local_90);
        statement_base::run((statement_base *)in_stack_fffffffffffffe60);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e6599);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e65a5);
        if ((peVar2->return_fcall & 1U) != 0) goto LAB_005e668f;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e65c8);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e65d4);
        if ((peVar2->break_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5e65ea);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5e65f6);
          peVar2->break_block = false;
          goto LAB_005e668f;
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e6617);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e6623);
        if ((peVar2->continue_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5e6639);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5e6645);
          peVar2->continue_block = false;
          break;
        }
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                    *)in_stack_fffffffffffffe60);
      }
      scope_guard::clear((scope_guard *)0x5e666f);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe60);
    }
LAB_005e668f:
    scope_guard::~scope_guard((scope_guard *)0x5e669c);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}